

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O2

bool __thiscall gmlc::networking::TcpServer::start(TcpServer *this)

{
  pointer psVar1;
  pointer psVar2;
  TcpAcceptor *this_00;
  bool bVar3;
  byte bVar4;
  pointer psVar5;
  iterator __begin3;
  pointer psVar6;
  allocator<char> local_6d;
  undefined4 local_6c;
  string local_68;
  SocketFactory *local_48;
  
  if (((this->halted)._M_base._M_i & 1U) != 0) {
    bVar3 = reConnect(this,(milliseconds)0x3e8);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"reconnect failed",&local_6d);
      logger(this,0,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::
      vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
      ::clear(&this->acceptors);
      local_68._M_dataplus._M_p = &DAT_000000c8;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&local_68);
      LOCK();
      (this->halted)._M_base._M_i = false;
      UNLOCK();
      initialConnect(this);
      if (((this->halted)._M_base._M_i & 1U) != 0) {
        bVar3 = reConnect(this,(milliseconds)0x3e8);
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"reconnect part 2 failed",&local_6d);
          logger(this,0,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          bVar4 = 0;
          goto LAB_0032a4c2;
        }
      }
    }
  }
  std::mutex::lock(&this->accepting);
  psVar6 = (this->connections).
           super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->connections).
           super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != psVar1) {
    for (; psVar6 != psVar1; psVar6 = psVar6 + 1) {
      if (((((psVar6->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->receivingHalt).activated._M_base._M_i & 1U) == 0) {
        TcpConnection::startReceive
                  ((psVar6->
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->accepting);
  psVar2 = (this->acceptors).
           super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = &this->socket_factory;
  local_6c = (undefined4)CONCAT71((int7)((ulong)local_48 >> 8),1);
  for (psVar5 = (this->acceptors).
                super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1) {
    this_00 = (psVar5->super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    TcpConnection::create
              ((TcpConnection *)&stack0xffffffffffffffc0,local_48,this->ioctx,this->bufferSize);
    bVar3 = TcpAcceptor::start(this_00,(pointer *)&stack0xffffffffffffffc0);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"acceptor has failed to start",&local_6d);
      logger(this,0,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      local_6c = 0;
    }
  }
  bVar4 = (byte)local_6c;
LAB_0032a4c2:
  return (bool)(bVar4 & 1);
}

Assistant:

bool TcpServer::start()
{
    if (halted.load(std::memory_order_acquire)) {
        if (!reConnect(std::chrono::milliseconds(1000))) {
            logger(0, "reconnect failed");
            acceptors.clear();
            std::this_thread::sleep_for(std::chrono::milliseconds(200));
            halted.store(false);
            initialConnect();
            if (halted) {
                if (!reConnect(std::chrono::milliseconds(1000))) {
                    logger(0, "reconnect part 2 failed");
                    return false;
                }
            }
        }
    }

    {  // scope for the lock_guard
        std::lock_guard<std::mutex> lock(accepting);
        if (!connections.empty()) {
            for (auto& conn : connections) {
                if (!conn->isReceiving()) {
                    conn->startReceive();
                }
            }
        }
    }
    bool success = true;
    for (auto& acc : acceptors) {
        if (!acc->start(
                TcpConnection::create(socket_factory, ioctx, bufferSize))) {
            logger(0, "acceptor has failed to start");
            success = false;
        }
    }
    return success;
}